

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool tinyusdz::ascii::ParseUnregistredValue(string *_typeName,string *str,Value *value,string *err)

{
  pointer pcVar1;
  undefined4 uVar2;
  bool bVar3;
  long lVar4;
  optional<unsigned_int> *poVar5;
  optional<unsigned_int> oVar6;
  ulong uVar7;
  array<unsigned_int,_2UL> *paVar8;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vss;
  string typeName;
  Value dst;
  StreamReader sr;
  AsciiParser parser;
  array<unsigned_int,_2UL> *local_5d8 [2];
  array<unsigned_int,_2UL> local_5c8 [2];
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> local_5b8;
  string local_598;
  string local_578;
  string local_558;
  storage_union local_538;
  undefined **local_528;
  undefined1 local_520 [32];
  any *local_500;
  undefined1 local_4f8 [8];
  optional<unsigned_int> local_4f0;
  size_t local_4e8;
  optional<unsigned_int> oStack_4e0;
  
  if (value == (Value *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  pcVar1 = (_typeName->_M_dataplus)._M_p;
  local_500 = &value->v_;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_558,pcVar1,pcVar1 + _typeName->_M_string_length);
  local_4f8 = (undefined1  [8])&local_4e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"[]","");
  oVar6 = local_4f0;
  if (local_558._M_string_length < (ulong)local_4f0) {
    bVar3 = false;
  }
  else {
    lVar4 = ::std::__cxx11::string::find
                      ((char *)&local_558,(ulong)local_4f8,
                       local_558._M_string_length - (long)local_4f0);
    bVar3 = lVar4 != -1;
  }
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8 + 1);
  }
  if (bVar3) {
    local_520._0_8_ = local_520 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"[]","");
    oVar6 = (optional<unsigned_int>)local_520._8_8_;
    if ((local_558._M_string_length < (ulong)local_520._8_8_) ||
       (lVar4 = ::std::__cxx11::string::find
                          ((char *)&local_558,local_520._0_8_,
                           local_558._M_string_length - local_520._8_8_), lVar4 == -1)) {
      local_4f8 = (undefined1  [8])&local_4e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_4f8,local_558._M_dataplus._M_p,
                 local_558._M_dataplus._M_p + local_558._M_string_length);
    }
    else {
      oVar6 = (optional<unsigned_int>)(local_558._M_string_length - local_520._8_8_);
      ::std::__cxx11::string::substr((ulong)local_4f8,(ulong)&local_558);
    }
    ::std::__cxx11::string::operator=((string *)&local_558,(string *)local_4f8);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8 + 1);
    }
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_,CONCAT71(local_520._17_7_,local_520[0x10]) + 1);
    }
  }
  tinyusdz::value::TryGetTypeId((optional<unsigned_int> *)local_4f8,&local_558);
  if (local_4f8[0] == (string)0x0) {
    if (err != (string *)0x0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_520,"Unsupported type: ",&local_558);
      poVar5 = (optional<unsigned_int> *)::std::__cxx11::string::append((char *)local_520);
      oVar6 = (optional<unsigned_int>)(poVar5 + 2);
      if (*poVar5 == oVar6) {
        local_4e8 = *(size_t *)oVar6;
        oStack_4e0 = poVar5[3];
        local_4f8 = (undefined1  [8])&local_4e8;
      }
      else {
        local_4e8 = *(size_t *)oVar6;
        local_4f8 = (undefined1  [8])*poVar5;
      }
      local_4f0 = poVar5[1];
      *poVar5 = oVar6;
      poVar5[1].has_value_ = false;
      *(undefined3 *)&poVar5[1].field_0x1 = 0;
      poVar5[1].contained = (storage_t<unsigned_int>)0x0;
      poVar5[2].has_value_ = false;
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4f8);
      if (local_4f8 != (undefined1  [8])&local_4e8) {
        operator_delete((void *)local_4f8,local_4e8 + 1);
      }
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,CONCAT71(local_520._17_7_,local_520[0x10]) + 1);
      }
    }
    bVar3 = false;
    goto LAB_0039bbae;
  }
  uVar2 = local_4f8._4_4_;
  local_520._0_8_ = (str->_M_dataplus)._M_p;
  local_520._8_8_ = str->_M_string_length;
  local_520[0x10] = false;
  local_520._24_8_ = 0;
  AsciiParser::AsciiParser((AsciiParser *)local_4f8,(StreamReader *)local_520);
  local_528 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_538.dynamic = (void *)0x0;
  if ((storage_t<unsigned_int>)uVar2 == (storage_t<unsigned_int>)0x27) {
    if (bVar3) {
      local_5b8.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (array<unsigned_int,_2UL> *)0x0;
      local_5b8.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_5b8.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                        ((AsciiParser *)local_4f8,
                         (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          *)&local_5b8);
      if (bVar3) {
        linb::any::operator=
                  ((any *)&local_538,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)&local_5b8);
      }
      else if (err != (string *)0x0) {
        local_5d8[0] = local_5c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5d8,"Failed to parse a value of type `{}[]`","");
        local_598.field_2._M_allocated_capacity._4_2_ = 0x34;
LAB_0039ba20:
        local_598.field_2._M_allocated_capacity._0_4_ = 0x746e6975;
        local_598._M_string_length = 5;
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        fmt::format<std::__cxx11::string>
                  (&local_578,(fmt *)local_5d8,&local_598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oVar6);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_578);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,
                          CONCAT26(local_598.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_598.field_2._M_allocated_capacity._4_2_,
                                            local_598.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if (local_5d8[0] != local_5c8) {
          operator_delete(local_5d8[0],(long)local_5c8[0]._M_elems + 1);
        }
      }
LAB_0039ba90:
      if (local_5b8.
          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (array<unsigned_int,_2UL> *)0x0) {
        uVar7 = (long)local_5b8.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_5b8.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        paVar8 = local_5b8.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_0039bb59:
        operator_delete(paVar8,uVar7);
      }
    }
    else {
      bVar3 = AsciiParser::ReadBasicType((AsciiParser *)local_4f8,(uint4 *)&local_5b8);
      if (bVar3) {
        linb::any::operator=((any *)&local_538,(array<unsigned_int,_4UL> *)&local_5b8);
      }
      else if (err != (string *)0x0) {
        local_5d8[0] = local_5c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5d8,"Failed to parse a value of type `{}`","");
        local_598.field_2._M_allocated_capacity._4_2_ = 0x34;
LAB_0039baee:
        local_598.field_2._M_allocated_capacity._0_4_ = 0x746e6975;
        local_598._M_string_length = 5;
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        fmt::format<std::__cxx11::string>
                  (&local_578,(fmt *)local_5d8,&local_598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oVar6);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_578);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,
                          CONCAT26(local_598.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_598.field_2._M_allocated_capacity._4_2_,
                                            local_598.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if (local_5d8[0] != local_5c8) {
          uVar7 = (long)local_5c8[0]._M_elems + 1;
          paVar8 = local_5d8[0];
          goto LAB_0039bb59;
        }
      }
    }
LAB_0039bb5e:
    if (bVar3 == false) goto LAB_0039bb7c;
    linb::any::operator=(local_500,(any *)&local_538);
    bVar3 = true;
  }
  else {
    if ((storage_t<unsigned_int>)uVar2 == (storage_t<unsigned_int>)0x26) {
      if (bVar3) {
        local_5b8.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (array<unsigned_int,_2UL> *)0x0;
        local_5b8.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_5b8.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                          ((AsciiParser *)local_4f8,
                           (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)&local_5b8);
        if (bVar3) {
          linb::any::operator=
                    ((any *)&local_538,
                     (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      *)&local_5b8);
        }
        else if (err != (string *)0x0) {
          local_5d8[0] = local_5c8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5d8,"Failed to parse a value of type `{}[]`","");
          local_598.field_2._M_allocated_capacity._4_2_ = 0x33;
          goto LAB_0039ba20;
        }
        goto LAB_0039ba90;
      }
      bVar3 = AsciiParser::ReadBasicType((AsciiParser *)local_4f8,(uint3 *)&local_5b8);
      if (bVar3) {
        linb::any::operator=((any *)&local_538,(array<unsigned_int,_3UL> *)&local_5b8);
      }
      else if (err != (string *)0x0) {
        local_5d8[0] = local_5c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5d8,"Failed to parse a value of type `{}`","");
        local_598.field_2._M_allocated_capacity._4_2_ = 0x33;
        goto LAB_0039baee;
      }
      goto LAB_0039bb5e;
    }
    if ((storage_t<unsigned_int>)uVar2 == (storage_t<unsigned_int>)0x25) {
      if (bVar3) {
        local_5b8.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (array<unsigned_int,_2UL> *)0x0;
        local_5b8.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_5b8.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                          ((AsciiParser *)local_4f8,&local_5b8);
        if (bVar3) {
          linb::any::operator=((any *)&local_538,&local_5b8);
        }
        else if (err != (string *)0x0) {
          local_5d8[0] = local_5c8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5d8,"Failed to parse a value of type `{}[]`","");
          local_598.field_2._M_allocated_capacity._4_2_ = 0x32;
          goto LAB_0039ba20;
        }
        goto LAB_0039ba90;
      }
      bVar3 = AsciiParser::ReadBasicType((AsciiParser *)local_4f8,(uint2 *)&local_5b8);
      if (bVar3) {
        linb::any::operator=((any *)&local_538,(array<unsigned_int,_2UL> *)&local_5b8);
      }
      else if (err != (string *)0x0) {
        local_5d8[0] = local_5c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5d8,"Failed to parse a value of type `{}`","");
        local_598.field_2._M_allocated_capacity._4_2_ = 0x32;
        goto LAB_0039baee;
      }
      goto LAB_0039bb5e;
    }
    if (err != (string *)0x0) {
      local_5d8[0] = local_5c8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5d8,"Unsupported or unimplemeneted type `{}`","");
      fmt::format<std::__cxx11::string>
                (&local_578,(fmt *)local_5d8,(string *)&local_558,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oVar6);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_578);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      if (local_5d8[0] != local_5c8) {
        operator_delete(local_5d8[0],(long)local_5c8[0]._M_elems + 1);
      }
    }
LAB_0039bb7c:
    bVar3 = false;
  }
  if (local_528 != (undefined **)0x0) {
    (*(code *)local_528[4])(&local_538);
    local_528 = (undefined **)0x0;
  }
  AsciiParser::~AsciiParser((AsciiParser *)local_4f8);
LAB_0039bbae:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool ParseUnregistredValue(const std::string &_typeName, const std::string &str,
                           value::Value *value, std::string *err) {
  if (!value) {
    if (err) {
      (*err) += "`value` argument is nullptr.\n";
    }
    return false;
  }

  bool array_qual = false;
  std::string typeName = _typeName;
  if (endsWith(typeName, "[]")) {
    typeName = removeSuffix(typeName, "[]");
    array_qual = true;
  }

  nonstd::optional<uint32_t> typeId = value::TryGetTypeId(typeName);

  if (!typeId) {
    if (err) {
      (*err) += "Unsupported type: " + typeName + "\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

#define PARSE_BASE_TYPE(__ty)                                            \
  case value::TypeTraits<__ty>::type_id(): {                             \
    if (array_qual) {                                                    \
      std::vector<__ty> vss;                                             \
      if (!parser.ParseBasicTypeArray(&vss)) {                           \
        if (err) {                                                       \
          (*err) = fmt::format("Failed to parse a value of type `{}[]`", \
                               value::TypeTraits<__ty>::type_name());    \
        }                                                                \
        return false;                                                    \
      }                                                                  \
      dst = vss;                                                         \
    } else {                                                             \
      __ty val;                                                          \
      if (!parser.ReadBasicType(&val)) {                                 \
        if (err) {                                                       \
          (*err) = fmt::format("Failed to parse a value of type `{}`",   \
                               value::TypeTraits<__ty>::type_name());    \
        }                                                                \
        return false;                                                    \
      }                                                                  \
      dst = val;                                                         \
    }                                                                    \
    break;                                                               \
  }

  value::Value dst;

  switch (typeId.value()) {
    PARSE_BASE_TYPE(value::uint2)
    PARSE_BASE_TYPE(value::uint3)
    PARSE_BASE_TYPE(value::uint4)
    default: {
      if (err) {
        (*err) =
            fmt::format("Unsupported or unimplemeneted type `{}`", typeName);
      }
      return false;
    }
  }

  (*value) = std::move(dst);

  return true;
}